

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O0

array<unsigned_int,_3UL> __thiscall
polyscope::render::ManagedBuffer<float>::getTextureSize(ManagedBuffer<float> *this)

{
  long in_RDI;
  allocator local_39;
  string local_38 [40];
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  if (*(int *)(in_RDI + 0x90) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"managed buffer is not a texture",&local_39);
    exception((string *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return (array<unsigned_int,_3UL>)*(_Type *)(in_RDI + 0x94);
}

Assistant:

std::array<uint32_t, 3> ManagedBuffer<T>::getTextureSize() const {
  if (deviceBufferType == DeviceBufferType::Attribute) exception("managed buffer is not a texture");
  return std::array<uint32_t, 3>{sizeX, sizeY, sizeZ};
}